

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O2

uint8 * crnlib::image_utils::read_image_from_memory
                  (uint8 *pImage,int nSize,int *pWidth,int *pHeight,int *pActualComps,int req_comps,
                  char *pFilename)

{
  bool bVar1;
  image<crnlib::color_quad<unsigned_char,_int>_> *other;
  uint8 *__dest;
  int iVar2;
  size_t __size;
  uint32 n;
  image_u8 luma_img;
  mipmapped_texture tex;
  buffer_stream buf_stream;
  image_u8 img;
  data_stream_serializer serializer;
  pixel_packer packer;
  
  *pWidth = 0;
  *pHeight = 0;
  *pActualComps = 0;
  if (req_comps - 5U < 0xfffffffc) {
    __dest = (uint8 *)0x0;
  }
  else {
    mipmapped_texture::mipmapped_texture(&tex);
    buffer_stream::buffer_stream(&buf_stream,pImage,nSize);
    data_stream::set_name(&buf_stream.super_data_stream,pFilename);
    serializer.m_little_endian = true;
    serializer.m_pStream = &buf_stream.super_data_stream;
    bVar1 = mipmapped_texture::read_from_stream(&tex,&serializer,cFormatInvalid);
    if ((!bVar1) ||
       ((bVar1 = mipmapped_texture::is_packed(&tex), bVar1 &&
        (bVar1 = mipmapped_texture::unpack_from_dxt(&tex,true), !bVar1)))) {
      __dest = (uint8 *)0x0;
    }
    else {
      img.m_width = 0;
      img.m_height = 0;
      img.m_pitch = 0;
      img.m_total = 0;
      img.m_comp_flags = 0xf;
      img.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
      img.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
      img.m_pixel_buf.m_size = 0;
      img.m_pixel_buf.m_capacity = 0;
      other = mipmapped_texture::get_level_image(&tex,0,0,&img,3);
      if (other == (image_u8 *)0x0) {
        __dest = (uint8 *)0x0;
      }
      else {
        *pWidth = tex.m_width;
        *pHeight = tex.m_height;
        bVar1 = (other->m_comp_flags & 0x10) == 0;
        iVar2 = 4;
        if ((other->m_comp_flags & 8) == 0) {
          iVar2 = bVar1 + 1 + (uint)bVar1;
        }
        *pActualComps = iVar2;
        if (req_comps == 4) {
          __size = (ulong)(tex.m_height * tex.m_width) << 2;
          __dest = (uint8 *)malloc(__size);
          memcpy(__dest,other->m_pPixels,__size);
        }
        else {
          luma_img.m_width = 0;
          luma_img.m_height = 0;
          luma_img.m_pitch = 0;
          luma_img.m_total = 0;
          luma_img.m_comp_flags = 0xf;
          luma_img.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
          luma_img.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
          luma_img.m_pixel_buf.m_size = 0;
          luma_img.m_pixel_buf.m_capacity = 0;
          if (req_comps == 1) {
            image<crnlib::color_quad<unsigned_char,_int>_>::operator=(&luma_img,other);
            image<crnlib::color_quad<unsigned_char,_int>_>::convert_to_grayscale(&luma_img);
            other = &luma_img;
          }
          pixel_packer::init(&packer,(EVP_PKEY_CTX *)(ulong)(uint)req_comps);
          __dest = pack_image<crnlib::image<crnlib::color_quad<unsigned_char,int>>>
                             (other,&packer,&n);
          vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&luma_img.m_pixel_buf);
        }
      }
      vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&img.m_pixel_buf);
    }
    data_stream::~data_stream(&buf_stream.super_data_stream);
    mipmapped_texture::~mipmapped_texture(&tex);
  }
  return __dest;
}

Assistant:

uint8* read_image_from_memory(const uint8* pImage, int nSize, int* pWidth, int* pHeight, int* pActualComps, int req_comps, const char* pFilename) {
  *pWidth = 0;
  *pHeight = 0;
  *pActualComps = 0;

  if ((req_comps < 1) || (req_comps > 4))
    return NULL;

  mipmapped_texture tex;

  buffer_stream buf_stream(pImage, nSize);
  buf_stream.set_name(pFilename);
  data_stream_serializer serializer(buf_stream);

  if (!tex.read_from_stream(serializer))
    return NULL;

  if (tex.is_packed()) {
    if (!tex.unpack_from_dxt(true))
      return NULL;
  }

  image_u8 img;
  image_u8* pImg = tex.get_level_image(0, 0, img);
  if (!pImg)
    return NULL;

  *pWidth = tex.get_width();
  *pHeight = tex.get_height();

  if (pImg->has_alpha())
    *pActualComps = 4;
  else if (pImg->is_grayscale())
    *pActualComps = 1;
  else
    *pActualComps = 3;

  uint8* pDst = NULL;
  if (req_comps == 4) {
    pDst = (uint8*)malloc(tex.get_total_pixels() * sizeof(uint32));
    uint8* pSrc = (uint8*)pImg->get_ptr();
    memcpy(pDst, pSrc, tex.get_total_pixels() * sizeof(uint32));
  } else {
    image_u8 luma_img;
    if (req_comps == 1) {
      luma_img = *pImg;
      luma_img.convert_to_grayscale();
      pImg = &luma_img;
    }

    pixel_packer packer(req_comps, 8);
    uint32 n;
    pDst = image_utils::pack_image(*pImg, packer, n);
  }

  return pDst;
}